

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::DeconvolutionDepthWise_x86_fma::forward
          (DeconvolutionDepthWise_x86_fma *this,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  _func_int **pp_Var1;
  Layer *pLVar2;
  ParamDictPrivate **ppPVar3;
  undefined8 in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  Mat weights [2];
  ParamDict pd;
  Layer *op;
  Mat *_bias_data;
  Mat bias_data_flattened;
  int k;
  int j;
  int i;
  float *wg;
  float *wg2;
  int g;
  int maxk;
  int inch_g;
  int outch_g;
  Mat weight_data_transposed;
  Mat weight_data_flattened;
  int _num_output;
  int _kernel_h;
  int _kernel_w;
  int _num_input;
  Mat *top_blob;
  Mat *_weight_data;
  Mat *bottom_blob;
  ParamDict *in_stack_fffffffffffffaa0;
  Mat *in_stack_fffffffffffffaa8;
  void **ppvVar4;
  undefined4 in_stack_fffffffffffffab0;
  int in_stack_fffffffffffffab4;
  Mat *in_stack_fffffffffffffab8;
  ParamDict *pPVar5;
  Mat *in_stack_fffffffffffffac0;
  Option *in_stack_fffffffffffffad0;
  Mat *in_stack_fffffffffffffad8;
  Mat *in_stack_fffffffffffffae0;
  ParamDict *local_4f8;
  ParamDict *local_4a8;
  undefined1 local_418 [16];
  ParamDict local_408;
  _func_int **local_3f8;
  undefined4 local_3f0;
  _func_int **local_3e8;
  undefined4 local_3e0;
  undefined4 local_3dc;
  undefined4 local_3d8;
  undefined4 local_3d4;
  undefined4 local_3d0;
  _func_int **local_3c8;
  void *local_3c0;
  int *local_3b8;
  void *local_3b0;
  undefined4 local_3a8;
  long *local_3a0;
  undefined4 local_398;
  undefined4 local_394;
  undefined4 local_390;
  undefined4 local_38c;
  undefined4 local_388;
  void *local_380;
  ParamDict local_378;
  Layer *local_368;
  const_reference local_360;
  void *local_358;
  int *local_350;
  ulong local_348;
  int local_340;
  long *local_338;
  undefined4 local_330;
  int local_32c;
  undefined4 local_328;
  undefined4 local_324;
  int local_320;
  long local_318;
  int local_30c;
  int local_308;
  int local_304;
  void *local_300;
  void *local_2f8;
  int local_2f0;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  ParamDict local_2e0;
  undefined8 local_2d0;
  undefined4 local_2c8;
  long *local_2c0;
  undefined4 local_2b8;
  int local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  int local_2a8;
  long local_2a0;
  undefined4 local_298;
  void *local_288;
  int *local_280;
  ulong local_278;
  int local_270;
  long *local_268;
  undefined4 local_260;
  int local_25c;
  undefined4 local_258;
  undefined4 local_254;
  int local_250;
  long local_248;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  reference local_230;
  const_reference local_228;
  const_reference local_220;
  undefined8 local_218;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_210;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_208;
  int local_1f4;
  void **local_1f0;
  ParamDict *local_1e8;
  void **local_1e0;
  ParamDict *local_1d8;
  ParamDict *local_1d0;
  void **local_1c8;
  ParamDictPrivate **local_1b8;
  void **local_1a8;
  ParamDict *local_198;
  void **local_188;
  int local_178;
  undefined4 local_174;
  void **local_170;
  void **local_168;
  void **local_160;
  int local_158;
  undefined4 local_154;
  ParamDict *local_150;
  ParamDict *local_148;
  ParamDict *local_140;
  int local_138;
  undefined4 local_134;
  ParamDict *local_130;
  int local_128;
  undefined4 local_124;
  void **local_120;
  int local_108;
  undefined4 local_104;
  void **local_100;
  int local_e8;
  undefined4 local_e4;
  ParamDict *local_e0;
  int local_c8;
  undefined4 local_c4;
  void **local_c0;
  int local_a8;
  undefined4 local_a4;
  ParamDictPrivate **local_a0;
  void **local_88;
  ParamDict *local_80;
  void **local_78;
  ParamDictPrivate *local_68;
  void *local_58;
  _func_int **local_48;
  void *local_38;
  void **local_18;
  ParamDict *local_10;
  void **local_8;
  
  local_218 = in_RCX;
  local_210 = in_RDX;
  local_208 = in_RSI;
  local_220 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_228 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_208,1);
  local_230 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_210,0);
  local_234 = local_220->c * local_220->elempack;
  local_238 = local_228->w;
  local_23c = local_228->h;
  local_240 = local_228->d * *(int *)(in_RDI + 0x114);
  local_1f0 = &local_288;
  local_288 = (void *)0x0;
  local_280 = (int *)0x0;
  local_278 = 0;
  local_270 = 0;
  local_268 = (long *)0x0;
  local_260 = 0;
  local_25c = 0;
  local_258 = 0;
  local_254 = 0;
  local_250 = 0;
  local_248 = 0;
  flatten(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
  local_78 = &local_288;
  if (local_288 != (void *)0x0) {
    local_18 = local_78;
  }
  if (local_288 == (void *)0x0 || local_248 * local_250 == 0) {
    local_1f4 = -100;
    local_298 = 1;
    goto LAB_0162523f;
  }
  local_25c = local_270 * local_25c;
  local_278 = local_278 / (ulong)(long)local_270;
  local_270 = 1;
  local_1e8 = &local_2e0;
  local_2e0._vptr_ParamDict = (_func_int **)0x0;
  local_2e0.d = (ParamDictPrivate *)0x0;
  local_2d0 = 0;
  local_2c8 = 0;
  local_2c0 = (long *)0x0;
  local_2b8 = 0;
  local_2b4 = 0;
  local_2b0 = 0;
  local_2ac = 0;
  local_2a8 = 0;
  local_2a0 = 0;
  Mat::create(in_stack_fffffffffffffac0,(int)((ulong)in_stack_fffffffffffffab8 >> 0x20),
              CONCAT44(in_stack_fffffffffffffab4,in_stack_fffffffffffffab0),
              (Allocator *)in_stack_fffffffffffffaa8);
  local_80 = &local_2e0;
  if (local_2e0._vptr_ParamDict != (_func_int **)0x0) {
    local_10 = local_80;
  }
  if (local_2e0._vptr_ParamDict != (_func_int **)0x0 && local_2a0 * local_2a8 != 0) {
    local_2e4 = local_240 / *(int *)(in_RDI + 0x114);
    local_2e8 = local_234 / *(int *)(in_RDI + 0x114);
    local_2ec = local_23c * local_238;
    for (local_2f0 = 0; local_2f0 < *(int *)(in_RDI + 0x114); local_2f0 = local_2f0 + 1) {
      local_1d0 = &local_2e0;
      local_2f8 = (void *)((long)local_2e0._vptr_ParamDict +
                          (long)(local_2f0 * local_2e4 * local_2e8 * local_2ec) * 4);
      local_1c8 = &local_288;
      local_300 = (void *)((long)local_288 +
                          (long)(local_2f0 * local_2e8 * local_2e4 * local_2ec) * 4);
      for (local_304 = 0; local_304 < local_2e4; local_304 = local_304 + 1) {
        for (local_308 = 0; local_308 < local_2e8; local_308 = local_308 + 1) {
          for (local_30c = 0; local_30c < local_2ec; local_30c = local_30c + 1) {
            *(undefined4 *)
             ((long)local_2f8 +
             (long)((local_304 * local_2e8 + local_308) * local_2ec + local_30c) * 4) =
                 *(undefined4 *)
                  ((long)local_300 +
                  (long)((local_308 * local_2e4 + local_304) * local_2ec + local_30c) * 4);
          }
        }
      }
    }
    local_1e0 = &local_358;
    local_358 = (void *)0x0;
    local_350 = (int *)0x0;
    local_348 = 0;
    local_340 = 0;
    local_338 = (long *)0x0;
    local_330 = 0;
    local_32c = 0;
    local_328 = 0;
    local_324 = 0;
    local_320 = 0;
    local_318 = 0;
    if (*(int *)(in_RDI + 0x10c) == 0) {
LAB_016241d5:
      local_368 = create_layer_cpu((int)((ulong)in_stack_fffffffffffffaa8 >> 0x20));
      ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffffac0);
      ParamDict::set(&local_378,0,local_240);
      ParamDict::set(&local_378,1,local_238);
      ParamDict::set(&local_378,0xb,local_23c);
      ParamDict::set(&local_378,2,*(int *)(in_RDI + 0xdc));
      ParamDict::set(&local_378,0xc,*(int *)(in_RDI + 0xe0));
      ParamDict::set(&local_378,3,*(int *)(in_RDI + 0xe4));
      ParamDict::set(&local_378,0xd,*(int *)(in_RDI + 0xe8));
      ParamDict::set(&local_378,4,*(int *)(in_RDI + 0xec));
      ParamDict::set(&local_378,0xf,*(int *)(in_RDI + 0xf0));
      ParamDict::set(&local_378,0xe,*(int *)(in_RDI + 0xf4));
      ParamDict::set(&local_378,0x10,*(int *)(in_RDI + 0xf8));
      ParamDict::set(&local_378,0x12,*(int *)(in_RDI + 0xfc));
      ParamDict::set(&local_378,0x13,*(int *)(in_RDI + 0x100));
      ParamDict::set(&local_378,0x14,*(int *)(in_RDI + 0x104));
      ParamDict::set(&local_378,0x15,*(int *)(in_RDI + 0x108));
      ParamDict::set(&local_378,5,*(int *)(in_RDI + 0x10c));
      ParamDict::set(&local_378,6,local_2b4);
      ParamDict::set(&local_378,7,*(int *)(in_RDI + 0x114));
      ParamDict::set(&local_378,9,*(int *)(in_RDI + 0x118));
      ParamDict::set((ParamDict *)in_stack_fffffffffffffab8,in_stack_fffffffffffffab4,
                     in_stack_fffffffffffffaa8);
      (*local_368->_vptr_Layer[2])(local_368,&local_378);
      local_4a8 = &local_408;
      do {
        local_1d8 = local_4a8;
        local_4a8->_vptr_ParamDict = (_func_int **)0x0;
        local_4a8->d = (ParamDictPrivate *)0x0;
        local_4a8[1]._vptr_ParamDict = (_func_int **)0x0;
        *(undefined4 *)&local_4a8[1].d = 0;
        local_4a8[2]._vptr_ParamDict = (_func_int **)0x0;
        *(undefined4 *)&local_4a8[2].d = 0;
        *(undefined4 *)((long)&local_4a8[2].d + 4) = 0;
        *(undefined4 *)&local_4a8[3]._vptr_ParamDict = 0;
        *(undefined4 *)((long)&local_4a8[3]._vptr_ParamDict + 4) = 0;
        *(undefined4 *)&local_4a8[3].d = 0;
        local_4a8[4]._vptr_ParamDict = (_func_int **)0x0;
        local_4a8 = (ParamDict *)&local_4a8[4].d;
      } while (local_4a8 != &local_378);
      local_150 = &local_2e0;
      local_148 = &local_408;
      if (&local_408 != local_150) {
        if (local_2e0.d != (ParamDictPrivate *)0x0) {
          local_154 = 1;
          LOCK();
          local_158 = (local_2e0.d)->params[0].type;
          (local_2e0.d)->params[0].type = (local_2e0.d)->params[0].type + 1;
          UNLOCK();
        }
        local_130 = &local_408;
        if (local_408.d != (ParamDictPrivate *)0x0) {
          local_134 = 0xffffffff;
          LOCK();
          local_138 = (local_408.d)->params[0].type;
          (local_408.d)->params[0].type = (local_408.d)->params[0].type + -1;
          UNLOCK();
          if (local_138 == 1) {
            if (local_3e8 == (_func_int **)0x0) {
              if (local_408._vptr_ParamDict != (_func_int **)0x0) {
                free(local_408._vptr_ParamDict);
              }
            }
            else {
              (**(code **)(*local_3e8 + 0x18))(local_3e8,local_408._vptr_ParamDict);
            }
          }
        }
        local_408._vptr_ParamDict = local_150->_vptr_ParamDict;
        local_408.d = local_150->d;
        local_3f8 = local_150[1]._vptr_ParamDict;
        local_3f0 = *(undefined4 *)&local_150[1].d;
        local_3e8 = local_150[2]._vptr_ParamDict;
        local_3e0 = *(undefined4 *)&local_150[2].d;
        local_3dc = *(undefined4 *)((long)&local_150[2].d + 4);
        local_3d8 = *(undefined4 *)&local_150[3]._vptr_ParamDict;
        local_3d4 = *(undefined4 *)((long)&local_150[3]._vptr_ParamDict + 4);
        local_3d0 = *(undefined4 *)&local_150[3].d;
        local_3c8 = local_150[4]._vptr_ParamDict;
      }
      local_170 = &local_358;
      local_168 = &local_3c0;
      local_140 = &local_408;
      if (&local_3c0 != local_170) {
        if (local_350 != (int *)0x0) {
          local_174 = 1;
          LOCK();
          local_178 = *local_350;
          *local_350 = *local_350 + 1;
          UNLOCK();
        }
        local_120 = &local_3c0;
        if (local_3b8 != (int *)0x0) {
          local_124 = 0xffffffff;
          LOCK();
          local_128 = *local_3b8;
          *local_3b8 = *local_3b8 + -1;
          UNLOCK();
          if (local_128 == 1) {
            if (local_3a0 == (long *)0x0) {
              if (local_3c0 != (void *)0x0) {
                free(local_3c0);
              }
            }
            else {
              (**(code **)(*local_3a0 + 0x18))(local_3a0,local_3c0);
            }
          }
        }
        local_3c0 = *local_170;
        local_3b8 = (int *)local_170[1];
        local_3b0 = local_170[2];
        local_3a8 = *(undefined4 *)(local_170 + 3);
        local_3a0 = (long *)local_170[4];
        local_398 = *(undefined4 *)(local_170 + 5);
        local_394 = *(undefined4 *)((long)local_170 + 0x2c);
        local_390 = *(undefined4 *)(local_170 + 6);
        local_38c = *(undefined4 *)((long)local_170 + 0x34);
        local_388 = *(undefined4 *)(local_170 + 7);
        local_380 = local_170[8];
      }
      pLVar2 = local_368;
      local_160 = &local_3c0;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
      (*pLVar2->_vptr_Layer[3])(pLVar2,local_418);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)in_stack_fffffffffffffaa0)
      ;
      (*local_368->_vptr_Layer[4])(local_368,local_218);
      (*local_368->_vptr_Layer[7])(local_368,local_220,local_230,local_218);
      (*local_368->_vptr_Layer[5])(local_368,local_218);
      if (local_368 != (Layer *)0x0) {
        (*local_368->_vptr_Layer[1])();
      }
      local_1f4 = 0;
      local_298 = 1;
      local_4f8 = &local_378;
      do {
        ppPVar3 = &local_4f8[-5].d;
        local_1b8 = ppPVar3;
        local_a0 = ppPVar3;
        if (local_4f8[-4]._vptr_ParamDict != (_func_int **)0x0) {
          pp_Var1 = local_4f8[-4]._vptr_ParamDict;
          local_a4 = 0xffffffff;
          LOCK();
          local_a8 = *(int *)pp_Var1;
          *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
          UNLOCK();
          if (local_a8 == 1) {
            if (local_4f8[-3].d == (ParamDictPrivate *)0x0) {
              local_68 = *ppPVar3;
              if (local_68 != (ParamDictPrivate *)0x0) {
                free(local_68);
              }
            }
            else {
              (**(code **)(*(long *)(local_4f8[-3].d)->params + 0x18))(local_4f8[-3].d,*ppPVar3);
            }
          }
        }
        *ppPVar3 = (ParamDictPrivate *)0x0;
        local_4f8[-4].d = (ParamDictPrivate *)0x0;
        *(undefined4 *)&local_4f8[-3]._vptr_ParamDict = 0;
        *(undefined4 *)&local_4f8[-2]._vptr_ParamDict = 0;
        *(undefined4 *)((long)&local_4f8[-2]._vptr_ParamDict + 4) = 0;
        *(undefined4 *)&local_4f8[-2].d = 0;
        *(undefined4 *)((long)&local_4f8[-2].d + 4) = 0;
        *(undefined4 *)&local_4f8[-1]._vptr_ParamDict = 0;
        local_4f8[-1].d = (ParamDictPrivate *)0x0;
        local_4f8[-4]._vptr_ParamDict = (_func_int **)0x0;
        local_4f8 = (ParamDict *)ppPVar3;
      } while ((ParamDict *)ppPVar3 != &local_408);
      ParamDict::~ParamDict(in_stack_fffffffffffffaa0);
    }
    else {
      local_360 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_208,2);
      flatten(in_stack_fffffffffffffae0,in_stack_fffffffffffffad8,in_stack_fffffffffffffad0);
      local_88 = &local_358;
      if (local_358 != (void *)0x0) {
        local_8 = local_88;
      }
      if (local_358 != (void *)0x0 && local_318 * local_320 != 0) {
        local_32c = local_340 * local_32c;
        local_348 = local_348 / (ulong)(long)local_340;
        local_340 = 1;
        goto LAB_016241d5;
      }
      local_1f4 = -100;
      local_298 = 1;
    }
    local_1a8 = &local_358;
    local_c0 = local_1a8;
    if (local_350 != (int *)0x0) {
      local_c4 = 0xffffffff;
      LOCK();
      local_c8 = *local_350;
      *local_350 = *local_350 + -1;
      UNLOCK();
      if (local_c8 == 1) {
        if (local_338 == (long *)0x0) {
          local_58 = local_358;
          if (local_358 != (void *)0x0) {
            free(local_358);
          }
        }
        else {
          (**(code **)(*local_338 + 0x18))(local_338,local_358);
        }
      }
    }
    local_358 = (void *)0x0;
    local_348 = 0;
    local_340 = 0;
    local_330 = 0;
    local_32c = 0;
    local_328 = 0;
    local_324 = 0;
    local_320 = 0;
    local_318 = 0;
    local_350 = (int *)0x0;
  }
  else {
    local_1f4 = -100;
    local_298 = 1;
  }
  pPVar5 = &local_2e0;
  local_198 = pPVar5;
  local_e0 = pPVar5;
  if (local_2e0.d != (ParamDictPrivate *)0x0) {
    local_e4 = 0xffffffff;
    LOCK();
    local_e8 = (local_2e0.d)->params[0].type;
    (local_2e0.d)->params[0].type = (local_2e0.d)->params[0].type + -1;
    UNLOCK();
    if (local_e8 == 1) {
      if (local_2c0 == (long *)0x0) {
        local_48 = local_2e0._vptr_ParamDict;
        if (local_2e0._vptr_ParamDict != (_func_int **)0x0) {
          free(local_2e0._vptr_ParamDict);
        }
      }
      else {
        (**(code **)(*local_2c0 + 0x18))(local_2c0,local_2e0._vptr_ParamDict);
      }
    }
  }
  pPVar5->_vptr_ParamDict = (_func_int **)0x0;
  pPVar5[1]._vptr_ParamDict = (_func_int **)0x0;
  *(undefined4 *)&pPVar5[1].d = 0;
  *(undefined4 *)&pPVar5[2].d = 0;
  *(undefined4 *)((long)&pPVar5[2].d + 4) = 0;
  *(undefined4 *)&pPVar5[3]._vptr_ParamDict = 0;
  *(undefined4 *)((long)&pPVar5[3]._vptr_ParamDict + 4) = 0;
  *(undefined4 *)&pPVar5[3].d = 0;
  pPVar5[4]._vptr_ParamDict = (_func_int **)0x0;
  pPVar5->d = (ParamDictPrivate *)0x0;
LAB_0162523f:
  ppvVar4 = &local_288;
  if (local_280 != (int *)0x0) {
    local_104 = 0xffffffff;
    LOCK();
    local_108 = *local_280;
    *local_280 = *local_280 + -1;
    UNLOCK();
    if (local_108 == 1) {
      local_188 = ppvVar4;
      local_100 = ppvVar4;
      if (local_268 == (long *)0x0) {
        local_38 = local_288;
        if (local_288 != (void *)0x0) {
          free(local_288);
        }
      }
      else {
        (**(code **)(*local_268 + 0x18))(local_268,local_288);
      }
    }
  }
  *ppvVar4 = (void *)0x0;
  ppvVar4[2] = (void *)0x0;
  *(undefined4 *)(ppvVar4 + 3) = 0;
  *(undefined4 *)(ppvVar4 + 5) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x2c) = 0;
  *(undefined4 *)(ppvVar4 + 6) = 0;
  *(undefined4 *)((long)ppvVar4 + 0x34) = 0;
  *(undefined4 *)(ppvVar4 + 7) = 0;
  ppvVar4[8] = (void *)0x0;
  ppvVar4[1] = (void *)0x0;
  return local_1f4;
}

Assistant:

int DeconvolutionDepthWise_x86_fma::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& _weight_data = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    const int _num_input = bottom_blob.c * bottom_blob.elempack;
    const int _kernel_w = _weight_data.w;
    const int _kernel_h = _weight_data.h;
    const int _num_output = _weight_data.d * group;

    Mat weight_data_flattened;
    flatten(_weight_data, weight_data_flattened, opt);
    if (weight_data_flattened.empty())
        return -100;

    // weight_data_flattened as pack1
    weight_data_flattened.w *= weight_data_flattened.elempack;
    weight_data_flattened.elemsize /= weight_data_flattened.elempack;
    weight_data_flattened.elempack = 1;

    // transpose group-inch/group-outch/group-kh-kw to group-outch/group-inch/group-kh-kw
    Mat weight_data_transposed;
    {
        weight_data_transposed.create(_kernel_w * _kernel_h * _num_output * _num_input / group, 4u, opt.workspace_allocator);
        if (weight_data_transposed.empty())
            return -100;

        const int outch_g = _num_output / group;
        const int inch_g = _num_input / group;
        const int maxk = _kernel_h * _kernel_w;

        for (int g = 0; g < group; g++)
        {
            // reorder weight from inch-outch to outch-inch
            float* wg2 = (float*)weight_data_transposed + g * outch_g * inch_g * maxk;
            const float* wg = (const float*)weight_data_flattened + g * inch_g * outch_g * maxk;
            for (int i = 0; i < outch_g; i++)
            {
                for (int j = 0; j < inch_g; j++)
                {
                    for (int k = 0; k < maxk; k++)
                    {
                        wg2[(i * inch_g + j) * maxk + k] = wg[(j * outch_g + i) * maxk + k];
                    }
                }
            }
        }
    }

    Mat bias_data_flattened;
    if (bias_term)
    {
        const Mat& _bias_data = bottom_blobs[2];
        flatten(_bias_data, bias_data_flattened, opt);
        if (bias_data_flattened.empty())
            return -100;

        // bias_data_flattened as pack1
        bias_data_flattened.w *= bias_data_flattened.elempack;
        bias_data_flattened.elemsize /= bias_data_flattened.elempack;
        bias_data_flattened.elempack = 1;
    }

    ncnn::Layer* op = ncnn::create_layer_cpu(ncnn::LayerType::DeconvolutionDepthWise);

    ncnn::ParamDict pd;
    pd.set(0, _num_output);
    pd.set(1, _kernel_w);
    pd.set(11, _kernel_h);
    pd.set(2, dilation_w);
    pd.set(12, dilation_h);
    pd.set(3, stride_w);
    pd.set(13, stride_h);
    pd.set(4, pad_left);
    pd.set(15, pad_right);
    pd.set(14, pad_top);
    pd.set(16, pad_bottom);
    pd.set(18, output_pad_right);
    pd.set(19, output_pad_bottom);
    pd.set(20, output_w);
    pd.set(21, output_h);
    pd.set(5, bias_term);
    pd.set(6, weight_data_transposed.w);
    pd.set(7, group);
    pd.set(9, activation_type);
    pd.set(10, activation_params);

    op->load_param(pd);

    ncnn::Mat weights[2];
    weights[0] = weight_data_transposed;
    weights[1] = bias_data_flattened;

    op->load_model(ncnn::ModelBinFromMatArray(weights));

    op->create_pipeline(opt);

    op->forward(bottom_blob, top_blob, opt);

    op->destroy_pipeline(opt);

    delete op;

    return 0;
}